

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

int AF_AActor_SetOrigin(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  AActor *this;
  bool bVar1;
  bool local_54;
  bool moving;
  double z;
  double y;
  double x;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x224,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x224,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_54 = true;
  if (this != (AActor *)0x0) {
    local_54 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_54 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x224,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x225,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x225,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x226,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x226,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x227,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x227,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 5) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x228,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x228,
                  "int AF_AActor_SetOrigin(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  AActor::SetOrigin(this,param[1].field_0.f,param[2].field_0.f,param[3].field_0.f,
                    param[4].field_0.i != 0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SetOrigin)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL(moving);
	self->SetOrigin(x, y, z, moving);
	return 0;
}